

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<ParamsStream<VectorWriter&,CAddress::SerParams>,std::vector<CAddress,std::allocator<CAddress>>>
          (VectorFormatter<DefaultFormatter> *this,
          ParamsStream<VectorWriter_&,_CAddress::SerParams> *s,
          vector<CAddress,_std::allocator<CAddress>_> *v)

{
  long lVar1;
  bool bVar2;
  vector<CAddress,_std::allocator<CAddress>_> *in_RSI;
  long in_FS_OFFSET;
  value_type *elem;
  vector<CAddress,_std::allocator<CAddress>_> *__range2;
  DefaultFormatter formatter;
  const_iterator __end0;
  const_iterator __begin0;
  ParamsStream<VectorWriter_&,_CAddress::SerParams> *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CAddress,_std::allocator<CAddress>_>::size
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffffa8);
  WriteCompactSize<ParamsStream<VectorWriter&,CAddress::SerParams>>
            ((ParamsStream<VectorWriter_&,_CAddress::SerParams> *)in_stack_ffffffffffffffb8,
             (uint64_t)in_RSI);
  std::vector<CAddress,_std::allocator<CAddress>_>::begin(in_RSI);
  std::vector<CAddress,_std::allocator<CAddress>_>::end(in_RSI);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
                      ((__normal_iterator<const_CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
                        *)in_stack_ffffffffffffffb8,
                       (__normal_iterator<const_CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
                        *)in_RSI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb8 =
         __gnu_cxx::
         __normal_iterator<const_CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>::
         operator*((__normal_iterator<const_CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
                    *)in_stack_ffffffffffffffa8);
    DefaultFormatter::Ser<ParamsStream<VectorWriter&,CAddress::SerParams>,CAddress>
              (in_stack_ffffffffffffffa8,(CAddress *)0x364a73);
    __gnu_cxx::
    __normal_iterator<const_CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>::
    operator++((__normal_iterator<const_CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
                *)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }